

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O1

bool __thiscall ACustomInventory::TryPickup(ACustomInventory *this,AActor **toucher)

{
  bool bVar1;
  int in_EAX;
  FState *pFVar2;
  FName local_28;
  FName local_24;
  
  local_24.Index = 0xad;
  local_28.Index = in_EAX;
  pFVar2 = AActor::FindState((AActor *)this,&local_24);
  bVar1 = CallStateChain(this,*toucher,pFVar2);
  if (pFVar2 == (FState *)0x0 || bVar1) {
    local_28.Index = 0xae;
    pFVar2 = AActor::FindState((AActor *)this,&local_28);
    if (pFVar2 != (FState *)0x0) {
      bVar1 = AInventory::TryPickup(&this->super_AInventory,toucher);
      return bVar1;
    }
  }
  if (bVar1) {
    (*(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[0x36])(this);
  }
  return bVar1;
}

Assistant:

bool ACustomInventory::TryPickup (AActor *&toucher)
{
	FState *pickupstate = FindState(NAME_Pickup);
	bool useok = CallStateChain (toucher, pickupstate);
	if ((useok || pickupstate == NULL) && FindState(NAME_Use) != NULL)
	{
		useok = Super::TryPickup (toucher);
	}
	else if (useok)
	{
		GoAwayAndDie();
	}
	return useok;
}